

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall
wasm_instance_t::wasm_instance_t(wasm_instance_t *this,RefPtr<wabt::interp::Instance> *ptr)

{
  RefPtr<wabt::interp::Object> RStack_28;
  
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Instance>(&RStack_28,ptr);
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr
            ((RefPtr<wabt::interp::Object> *)this,&RStack_28);
  wabt::interp::RefPtr<wabt::interp::Object>::reset(&RStack_28);
  return;
}

Assistant:

wasm_instance_t(RefPtr<Instance> ptr) : wasm_ref_t(ptr) {}